

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O2

int PARMCI_NbPutV(armci_giov_t *darr,int len,int proc,armci_hdl_t *nb_handle)

{
  int iVar1;
  comex_giov_t *b;
  
  b = (comex_giov_t *)malloc((long)len * 0x18);
  convert_giov(darr,b,len);
  iVar1 = comex_nbputv(b,len,proc,0,nb_handle);
  free(b);
  return iVar1;
}

Assistant:

int PARMCI_NbPutV(armci_giov_t *darr, int len, int proc, armci_hdl_t *nb_handle)
{
    int rc;
    comex_giov_t *adarr = malloc(sizeof(comex_giov_t) * len);
    convert_giov(darr, adarr, len);
    rc = comex_nbputv(adarr, len, proc, COMEX_GROUP_WORLD, nb_handle);
    free(adarr);
    return rc;
}